

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  string local_40;
  
  pcVar2 = *current;
  if ((long)end - (long)pcVar2 < 4) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Bad unicode escape sequence in string: four digits expected.",""
              );
    addError(this,&local_40,token,*current);
LAB_00110193:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    bVar3 = false;
  }
  else {
    *unicode = 0;
    uVar4 = 0;
    iVar5 = 4;
    do {
      *current = pcVar2 + 1;
      cVar1 = *pcVar2;
      iVar6 = (int)cVar1;
      uVar4 = uVar4 * 0x10;
      *unicode = uVar4;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar4 = (uVar4 + iVar6) - 0x30;
      }
      else if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar4 = (uVar4 + iVar6) - 0x57;
      }
      else {
        if (5 < (byte)(cVar1 + 0xbfU)) {
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "Bad unicode escape sequence in string: hexadecimal digit expected.","");
          addError(this,&local_40,token,*current);
          goto LAB_00110193;
        }
        uVar4 = (uVar4 + iVar6) - 0x37;
      }
      *unicode = uVar4;
      iVar5 = iVar5 + -1;
      pcVar2 = pcVar2 + 1;
    } while (iVar5 != 0);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  return true;
}